

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O1

int Test_SUNMatMatvecSetup(SUNMatrix A,int myid)

{
  int iVar1;
  char *__s;
  
  if (A->ops->matvecsetup == (_func_SUNErrCode_SUNMatrix *)0x0) {
    if (print_all_ranks == 0 && myid == 0) {
      puts("    PASSED test -- SUNMatMatvecSetup not implemented");
    }
    else if (print_all_ranks != 0) {
      iVar1 = 0;
      printf("process %06d: ",myid);
      __s = "    PASSED test -- SUNMatMatvecSetup not implemented";
      goto LAB_00104b2c;
    }
    return 0;
  }
  iVar1 = SUNMatMatvecSetup();
  sync_device(A);
  if (iVar1 != 0) {
    if (print_all_ranks == 0 && myid == 0) {
      puts(">>> FAILED test -- SUNMatMatvecSetup ");
      return 1;
    }
    iVar1 = 1;
    if (print_all_ranks == 0) {
      return 1;
    }
    printf("process %06d: ",myid);
    __s = ">>> FAILED test -- SUNMatMatvecSetup ";
LAB_00104b2c:
    puts(__s);
    return iVar1;
  }
  if (print_all_ranks != 0 || myid != 0) {
    if (print_all_ranks == 0) goto LAB_00104b57;
    printf("process %06d: ",myid);
  }
  puts("    PASSED test -- SUNMatMatvecSetup");
LAB_00104b57:
  if ((myid == 0) && (print_time != 0)) {
    printf("    SUNMatMatvecSetup Time: %22.15e \n \n",0);
  }
  return 0;
}

Assistant:

int Test_SUNMatMatvecSetup(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;

  if (A->ops->matvecsetup == NULL)
  {
    TEST_STATUS("    PASSED test -- SUNMatMatvecSetup not implemented\n", myid);
    return (0);
  }

  start_time = get_time();
  failure    = SUNMatMatvecSetup(A);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatMatvecSetup \n", myid);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatMatvecSetup\n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatMatvecSetup Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}